

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams::PaddingLayerParams
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  bool bVar1;
  PaddingTypeCase PVar2;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingConstant *this_01;
  PaddingLayerParams_PaddingConstant *from_00;
  PaddingLayerParams_PaddingReflection *this_02;
  PaddingLayerParams_PaddingReflection *from_01;
  PaddingLayerParams_PaddingReplication *this_03;
  PaddingLayerParams_PaddingReplication *from_02;
  PaddingLayerParams *from_local;
  PaddingLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PaddingLayerParams_006f4298;
  PaddingTypeUnion::PaddingTypeUnion((PaddingTypeUnion *)&this->PaddingType_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_paddingamounts(from);
  if (bVar1) {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from->paddingamounts_);
    this->paddingamounts_ = this_00;
  }
  else {
    this->paddingamounts_ = (BorderAmounts *)0x0;
  }
  clear_has_PaddingType(this);
  PVar2 = PaddingType_case(from);
  switch(PVar2) {
  case PADDINGTYPE_NOT_SET:
    break;
  case kConstant:
    this_01 = _internal_mutable_constant(this);
    from_00 = _internal_constant(from);
    PaddingLayerParams_PaddingConstant::MergeFrom(this_01,from_00);
    break;
  case kReflection:
    this_02 = _internal_mutable_reflection(this);
    from_01 = _internal_reflection(from);
    PaddingLayerParams_PaddingReflection::MergeFrom(this_02,from_01);
    break;
  case kReplication:
    this_03 = _internal_mutable_replication(this);
    from_02 = _internal_replication(from);
    PaddingLayerParams_PaddingReplication::MergeFrom(this_03,from_02);
  }
  return;
}

Assistant:

PaddingLayerParams::PaddingLayerParams(const PaddingLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = nullptr;
  }
  clear_has_PaddingType();
  switch (from.PaddingType_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from._internal_constant());
      break;
    }
    case kReflection: {
      _internal_mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from._internal_reflection());
      break;
    }
    case kReplication: {
      _internal_mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from._internal_replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PaddingLayerParams)
}